

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

String * __thiscall
kj::anon_unknown_123::LocalPeerIdentityImpl::toString
          (String *__return_storage_ptr__,LocalPeerIdentityImpl *this)

{
  uint *in_R8;
  char (*in_R9) [2];
  uint *u;
  ArrayPtr<char> buffer;
  ArrayPtr<char> buffer_00;
  char uidBuffer [16];
  char pidBuffer [16];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_48.size_ = 1;
  local_48.ptr = "";
  if ((this->creds).pid.ptr.isSet == true) {
    buffer.size_ = (size_t)" pid:";
    buffer.ptr = &DAT_00000010;
    local_48 = (ArrayPtr<const_char>)
               strPreallocated<char_const(&)[6],int&>
                         ((kj *)&local_28,buffer,(char (*) [6])&(this->creds).pid.ptr.field_1,
                          (int *)in_R8);
  }
  local_38 = 0;
  uStack_30 = 0;
  local_58.size_ = 1;
  local_58.ptr = "";
  if ((this->creds).uid.ptr.isSet == true) {
    buffer_00.size_ = (size_t)" uid:";
    buffer_00.ptr = &DAT_00000010;
    local_58 = (ArrayPtr<const_char>)
               strPreallocated<char_const(&)[6],unsigned_int&>
                         ((kj *)&local_38,buffer_00,(char (*) [6])&(this->creds).uid.ptr.field_1,
                          in_R8);
  }
  str<char_const(&)[12],kj::StringPtr&,kj::StringPtr&,char_const(&)[2]>
            (__return_storage_ptr__,(kj *)"(local peer",(char (*) [12])&local_48,
             (StringPtr *)&local_58,(StringPtr *)0x52a047,in_R9);
  return __return_storage_ptr__;
}

Assistant:

kj::String toString() override {
    char pidBuffer[16]{};
    kj::StringPtr pidStr = nullptr;
    KJ_IF_SOME(p, creds.pid) {
      pidStr = strPreallocated(pidBuffer, " pid:", p);
    }

    char uidBuffer[16]{};
    kj::StringPtr uidStr = nullptr;
    KJ_IF_SOME(u, creds.uid) {
      uidStr = strPreallocated(uidBuffer, " uid:", u);
    }

    return kj::str("(local peer", pidStr, uidStr, ")");
  }